

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackGenerator.cxx
# Opt level: O3

string * __thiscall
cmCPackGenerator::GetComponentPackageFileName
          (string *__return_storage_ptr__,cmCPackGenerator *this,string *initialPackageFileName,
          string *groupOrComponentName,bool isGroupName)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  long *plVar3;
  char *pcVar4;
  undefined8 *puVar5;
  size_t sVar6;
  size_type *psVar7;
  long *plVar8;
  string groupDispVar;
  string dispNameVar;
  string suffix;
  long *local_d0;
  long local_c8;
  long local_c0;
  long lStack_b8;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::operator+(&local_50,"-",groupOrComponentName);
  std::operator+(&local_90,"CPACK_",&this->Name);
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_90);
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  psVar7 = (size_type *)(plVar3 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar7) {
    local_70.field_2._M_allocated_capacity = *psVar7;
    local_70.field_2._8_8_ = plVar3[3];
  }
  else {
    local_70.field_2._M_allocated_capacity = *psVar7;
    local_70._M_dataplus._M_p = (pointer)*plVar3;
  }
  local_70._M_string_length = plVar3[1];
  *plVar3 = (long)psVar7;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  paVar1 = &local_90.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar1) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  pcVar4 = GetOption(this,&local_70);
  bVar2 = cmSystemTools::IsOn(pcVar4);
  if (!bVar2) goto LAB_0023db2f;
  local_90._M_dataplus._M_p = (pointer)paVar1;
  if (isGroupName) {
    cmsys::SystemTools::UpperCase(&local_b0,groupOrComponentName);
    plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,0x4e9bdb);
    plVar8 = plVar3 + 2;
    if ((long *)*plVar3 == plVar8) {
      local_c0 = *plVar8;
      lStack_b8 = plVar3[3];
      local_d0 = &local_c0;
    }
    else {
      local_c0 = *plVar8;
      local_d0 = (long *)*plVar3;
    }
    local_c8 = plVar3[1];
    *plVar3 = (long)plVar8;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_d0);
    psVar7 = (size_type *)(plVar3 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_90.field_2._M_allocated_capacity = *psVar7;
      local_90.field_2._8_8_ = plVar3[3];
    }
    else {
      local_90.field_2._M_allocated_capacity = *psVar7;
      local_90._M_dataplus._M_p = (pointer)*plVar3;
    }
    local_90._M_string_length = plVar3[1];
    *plVar3 = (long)psVar7;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    if (local_d0 != &local_c0) {
      operator_delete(local_d0,local_c0 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    pcVar4 = GetOption(this,&local_90);
    if (pcVar4 != (char *)0x0) {
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      sVar6 = strlen(pcVar4);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,pcVar4,pcVar4 + sVar6);
      plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,0x4ee51d);
LAB_0023da95:
      plVar8 = plVar3 + 2;
      if ((long *)*plVar3 == plVar8) {
        local_c0 = *plVar8;
        lStack_b8 = plVar3[3];
        local_d0 = &local_c0;
      }
      else {
        local_c0 = *plVar8;
        local_d0 = (long *)*plVar3;
      }
      local_c8 = plVar3[1];
      *plVar3 = (long)plVar8;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      std::__cxx11::string::operator=((string *)&local_50,(string *)&local_d0);
      if (local_d0 != &local_c0) {
        operator_delete(local_d0,local_c0 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
    }
  }
  else {
    cmsys::SystemTools::UpperCase(&local_b0,groupOrComponentName);
    plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,0x4e9c00);
    plVar8 = plVar3 + 2;
    if ((long *)*plVar3 == plVar8) {
      local_c0 = *plVar8;
      lStack_b8 = plVar3[3];
      local_d0 = &local_c0;
    }
    else {
      local_c0 = *plVar8;
      local_d0 = (long *)*plVar3;
    }
    local_c8 = plVar3[1];
    *plVar3 = (long)plVar8;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_d0);
    psVar7 = puVar5 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_90.field_2._M_allocated_capacity = *psVar7;
      local_90.field_2._8_8_ = puVar5[3];
    }
    else {
      local_90.field_2._M_allocated_capacity = *psVar7;
      local_90._M_dataplus._M_p = (pointer)*puVar5;
    }
    local_90._M_string_length = puVar5[1];
    *puVar5 = psVar7;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    if (local_d0 != &local_c0) {
      operator_delete(local_d0,local_c0 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    pcVar4 = GetOption(this,&local_90);
    if (pcVar4 != (char *)0x0) {
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      sVar6 = strlen(pcVar4);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,pcVar4,pcVar4 + sVar6);
      plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,0x4ee51d);
      goto LAB_0023da95;
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar1) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
LAB_0023db2f:
  std::operator+(__return_storage_ptr__,initialPackageFileName,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmCPackGenerator::GetComponentPackageFileName(
    const std::string& initialPackageFileName,
    const std::string& groupOrComponentName,
    bool isGroupName) {

  /*
   * the default behavior is to use the
   * component [group] name as a suffix
   */
  std::string suffix="-"+groupOrComponentName;
  /* check if we should use DISPLAY name */
  std::string dispNameVar = "CPACK_"+Name+"_USE_DISPLAY_NAME_IN_FILENAME";
  if (IsOn(dispNameVar))
    {
    /* the component Group case */
    if (isGroupName)
      {
      std::string groupDispVar = "CPACK_COMPONENT_GROUP_"
          + cmSystemTools::UpperCase(groupOrComponentName) + "_DISPLAY_NAME";
      const char* groupDispName = GetOption(groupDispVar);
      if (groupDispName)
        {
        suffix = "-"+std::string(groupDispName);
        }
      }
    /* the [single] component case */
    else
      {
      std::string dispVar = "CPACK_COMPONENT_"
           + cmSystemTools::UpperCase(groupOrComponentName) + "_DISPLAY_NAME";
            const char* dispName = GetOption(dispVar);
            if(dispName)
              {
              suffix = "-"+std::string(dispName);
              }
            }
      }
  return initialPackageFileName + suffix;
}